

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build_parser.cpp
# Opt level: O3

Parser * Omega_h::accept_parser(Parser *__return_storage_ptr__,ParserInProgress *pip)

{
  __uniq_ptr_data<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>,_true,_true>
  _Var1;
  bool bVar2;
  Action AVar3;
  pointer puVar4;
  pointer puVar5;
  int iVar6;
  int iVar7;
  Action *pAVar8;
  long lVar9;
  GrammarPtr local_48;
  Action *local_38;
  
  local_48.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pip->grammar).super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (pip->grammar).super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  if (local_48.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_48.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_48.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  Parser::Parser(__return_storage_ptr__,&local_48,
                 (int)((ulong)((long)(pip->states).
                                     super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pip->states).
                                    super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3));
  if (local_48.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (0 < (int)((ulong)((long)(pip->states).
                              super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pip->states).
                             super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    iVar7 = 0;
    do {
      add_state(__return_storage_ptr__);
      iVar7 = iVar7 + 1;
      puVar4 = (pip->states).
               super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar5 = (pip->states).
               super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar6 = (int)((ulong)((long)puVar5 - (long)puVar4) >> 3);
    } while (iVar7 < iVar6);
    if (0 < iVar6) {
      lVar9 = 0;
      do {
        _Var1.
        super___uniq_ptr_impl<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>
        ._M_t.
        super__Tuple_impl<0UL,_Omega_h::StateInProgress_*,_std::default_delete<Omega_h::StateInProgress>_>
        .super__Head_base<0UL,_Omega_h::StateInProgress_*,_false>._M_head_impl =
             puVar4[lVar9]._M_t.
             super___uniq_ptr_impl<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>
        ;
        pAVar8 = *(Action **)
                  ((long)_Var1.
                         super___uniq_ptr_impl<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Omega_h::StateInProgress_*,_std::default_delete<Omega_h::StateInProgress>_>
                         .super__Head_base<0UL,_Omega_h::StateInProgress_*,_false>._M_head_impl +
                  0x18);
        local_38 = *(Action **)
                    ((long)_Var1.
                           super___uniq_ptr_impl<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Omega_h::StateInProgress_*,_std::default_delete<Omega_h::StateInProgress>_>
                           .super__Head_base<0UL,_Omega_h::StateInProgress_*,_false>._M_head_impl +
                    0x20);
        if (pAVar8 != local_38) {
          do {
            if ((pAVar8->kind == ACTION_SHIFT) &&
               (bVar2 = is_nonterminal((pip->grammar).
                                       super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,*(int *)((long)pAVar8[4] + 0x20)), bVar2)) {
              iVar7 = as_nonterminal((pip->grammar).
                                     super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,*(int *)((long)pAVar8[4] + 0x20));
              add_nonterminal_action
                        (__return_storage_ptr__,(int)lVar9,iVar7,(pAVar8->field_1).production);
            }
            else {
              for (AVar3 = pAVar8[4]; AVar3 != (Action)(pAVar8 + 2);
                  AVar3 = (Action)std::_Rb_tree_increment((_Rb_tree_node_base *)AVar3)) {
                iVar7 = *(int *)((long)AVar3 + 0x20);
                bVar2 = is_terminal((pip->grammar).
                                    super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr,iVar7);
                if (!bVar2) {
                  fail("assertion %s failed at %s +%d\n","is_terminal(*grammar, terminal)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_build_parser.cpp"
                       ,0x465);
                }
                add_terminal_action(__return_storage_ptr__,(int)lVar9,iVar7,*pAVar8);
              }
            }
            pAVar8 = pAVar8 + 7;
          } while (pAVar8 != local_38);
          puVar4 = (pip->states).
                   super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar5 = (pip->states).
                   super__Vector_base<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>,_std::allocator<std::unique_ptr<Omega_h::StateInProgress,_std::default_delete<Omega_h::StateInProgress>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < (int)((ulong)((long)puVar5 - (long)puVar4) >> 3));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Parser accept_parser(ParserInProgress const& pip) {
  auto& sips = pip.states;
  auto& grammar = pip.grammar;
  auto out = Parser(grammar, size(sips));
  for (int s_i = 0; s_i < size(sips); ++s_i) {
    add_state(out);
  }
  for (int s_i = 0; s_i < size(sips); ++s_i) {
    auto& sip = *at(sips, s_i);
    for (auto& action : sip.actions) {
      if (action.action.kind == ACTION_SHIFT &&
          is_nonterminal(*grammar, *(action.context.begin()))) {
        auto nt = as_nonterminal(*grammar, *(action.context.begin()));
        add_nonterminal_action(out, s_i, nt, action.action.next_state);
      } else {
        for (auto terminal : action.context) {
          OMEGA_H_CHECK(is_terminal(*grammar, terminal));
          add_terminal_action(out, s_i, terminal, action.action);
        }
      }
    }
  }
  return out;
}